

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

basic_string_view<char,_std::char_traits<char>_> * __thiscall
frozen::bits::
LowerBound<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::doitfirst<std::basic_string_view<char,std::char_traits<char>>const*,5ul>
          (LowerBound<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           *this,long first)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  
  bVar1 = CLI::std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (*(less<std::basic_string_view<char,_std::char_traits<char>_>_> **)(this + 8),
                     (basic_string_view<char,_std::char_traits<char>_> *)(first + 0x30),
                     *(basic_string_view<char,_std::char_traits<char>_> **)this);
  if (bVar1) {
    pbVar2 = doit_fast<std::basic_string_view<char,std::char_traits<char>>const*,1ul>
                       (this,first + 0x40);
    return pbVar2;
  }
  pbVar2 = doit_fast<std::basic_string_view<char,std::char_traits<char>>const*,3ul>(this,first);
  return pbVar2;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }